

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

void tlb_init_m68k(CPUState *cpu)

{
  undefined8 *puVar1;
  void *pvVar2;
  void *__s;
  bool bVar3;
  gpointer pvVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  timeval tv;
  timeval local_40;
  
  pvVar2 = cpu->env_ptr;
  lVar7 = 0;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  *(undefined2 *)((long)pvVar2 + -0x5b0) = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    lVar6 = lVar7 * 0x10;
    puVar1 = (undefined8 *)((long)pvVar2 + lVar7 * 0x2b0 + -0x590);
    puVar1[1] = local_40.tv_usec * 1000 + local_40.tv_sec * 1000000000;
    puVar1[2] = 0;
    puVar1[3] = 0;
    *(undefined8 *)((long)pvVar2 + lVar6 + -0x30) = 0x3fc0;
    pvVar4 = g_malloc(0x4000);
    *(gpointer *)((long)pvVar2 + lVar6 + -0x28) = pvVar4;
    pvVar4 = g_malloc(0x1000);
    puVar1[0x55] = pvVar4;
    lVar7 = *(long *)((long)pvVar2 + lVar6 + -0x30);
    __s = *(void **)((long)pvVar2 + lVar6 + -0x28);
    puVar1[3] = 0;
    puVar1[4] = 0;
    *puVar1 = 0xffffffffffffffff;
    memset(__s,0xff,lVar7 + 0x40);
    memset(puVar1 + 5,0xff,0x200);
    lVar7 = 1;
    bVar3 = false;
  } while (bVar5);
  return;
}

Assistant:

void tlb_init(CPUState *cpu)
{
    CPUArchState *env = cpu->env_ptr;
    int64_t now = get_clock_realtime();
    int i;

    /* All tlbs are initialized flushed. */
    env_tlb(env)->c.dirty = 0;

    for (i = 0; i < NB_MMU_MODES; i++) {
        tlb_mmu_init(&env_tlb(env)->d[i], &env_tlb(env)->f[i], now);
    }
}